

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

uint8 * __thiscall
google::protobuf::ServiceDescriptorProto::SerializeWithCachedSizesToArray
          (ServiceDescriptorProto *this,uint8 *target)

{
  string *str;
  vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_> *pvVar1;
  uint8 *puVar2;
  Type *this_00;
  int i;
  int index;
  ServiceOptions *this_01;
  
  if ((this->_has_bits_[0] & 1) != 0) {
    internal::WireFormat::VerifyUTF8StringFallback
              ((this->name_->_M_dataplus)._M_p,(int)this->name_->_M_string_length,SERIALIZE);
    str = this->name_;
    *target = '\n';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray((uint32)str->_M_string_length,target + 1);
    target = io::CodedOutputStream::WriteStringToArray(str,puVar2);
  }
  for (index = 0; index < (this->method_).super_RepeatedPtrFieldBase.current_size_;
      index = index + 1) {
    this_00 = internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<google::protobuf::MethodDescriptorProto>::TypeHandler>
                        (&(this->method_).super_RepeatedPtrFieldBase,index);
    *target = '\x12';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this_00->_cached_size_,target + 1);
    target = MethodDescriptorProto::SerializeWithCachedSizesToArray(this_00,puVar2);
  }
  if ((this->_has_bits_[0] & 4) != 0) {
    this_01 = this->options_;
    if (this_01 == (ServiceOptions *)0x0) {
      this_01 = *(ServiceOptions **)(default_instance_ + 0x30);
    }
    *target = '\x1a';
    puVar2 = io::CodedOutputStream::WriteVarint32ToArray(this_01->_cached_size_,target + 1);
    target = ServiceOptions::SerializeWithCachedSizesToArray(this_01,puVar2);
  }
  pvVar1 = (this->_unknown_fields_).fields_;
  if ((pvVar1 != (vector<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
                  *)0x0) &&
     ((pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (pvVar1->
      super__Vector_base<google::protobuf::UnknownField,_std::allocator<google::protobuf::UnknownField>_>
      )._M_impl.super__Vector_impl_data._M_finish)) {
    puVar2 = internal::WireFormat::SerializeUnknownFieldsToArray(&this->_unknown_fields_,target);
    return puVar2;
  }
  return target;
}

Assistant:

::google::protobuf::uint8* ServiceDescriptorProto::SerializeWithCachedSizesToArray(
    ::google::protobuf::uint8* target) const {
  // optional string name = 1;
  if (has_name()) {
    ::google::protobuf::internal::WireFormat::VerifyUTF8String(
      this->name().data(), this->name().length(),
      ::google::protobuf::internal::WireFormat::SERIALIZE);
    target =
      ::google::protobuf::internal::WireFormatLite::WriteStringToArray(
        1, this->name(), target);
  }

  // repeated .google.protobuf.MethodDescriptorProto method = 2;
  for (int i = 0; i < this->method_size(); i++) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        2, this->method(i), target);
  }

  // optional .google.protobuf.ServiceOptions options = 3;
  if (has_options()) {
    target = ::google::protobuf::internal::WireFormatLite::
      WriteMessageNoVirtualToArray(
        3, this->options(), target);
  }

  if (!unknown_fields().empty()) {
    target = ::google::protobuf::internal::WireFormat::SerializeUnknownFieldsToArray(
        unknown_fields(), target);
  }
  return target;
}